

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaOverlay.cpp
# Opt level: O3

void cursespp::SchemaOverlay::ShowListOverlay
               (string *title,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *items,string *defaultValue,
               function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
               *cb)

{
  long lVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  string *title_00;
  int iVar3;
  ListOverlay *pLVar4;
  pointer pbVar5;
  OverlayStack *this;
  long lVar6;
  ulong uVar7;
  shared_ptr<StringListAdapter> stringAdapter;
  value_type current;
  shared_ptr<cursespp::ListOverlay> dialog;
  ulong local_e0;
  StringListAdapter *local_d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d0;
  _Any_data local_c8;
  _Manager_type local_b8;
  undefined8 uStack_b0;
  StringListAdapter *local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_a0;
  ListOverlay *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_90;
  ILayoutPtr local_88;
  IScrollAdapterPtr local_78;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *local_68;
  string *local_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  local_d8 = (StringListAdapter *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<StringListAdapter,std::allocator<StringListAdapter>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>
            (&local_d0,&local_d8,(allocator<StringListAdapter> *)&local_c8,items);
  pLVar4 = (ListOverlay *)operator_new(0x360);
  ListOverlay::ListOverlay(pLVar4);
  std::__shared_ptr<cursespp::ListOverlay,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<cursespp::ListOverlay,void>
            ((__shared_ptr<cursespp::ListOverlay,(__gnu_cxx::_Lock_policy)2> *)&local_98,pLVar4);
  pbVar5 = (items->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_68 = cb;
  local_60 = title;
  if ((items->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish == pbVar5) {
    local_e0 = 0;
  }
  else {
    lVar6 = 8;
    uVar7 = 0;
    local_e0 = 0;
    do {
      lVar1 = *(long *)((long)pbVar5 + lVar6 + -8);
      local_c8._M_unused._M_object = &local_b8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c8,lVar1,
                 *(long *)((long)&(pbVar5->_M_dataplus)._M_p + lVar6) + lVar1);
      if ((local_c8._8_8_ == defaultValue->_M_string_length) &&
         ((local_c8._8_8_ == 0 ||
          (iVar3 = bcmp(local_c8._M_unused._M_object,(defaultValue->_M_dataplus)._M_p,local_c8._8_8_
                       ), iVar3 == 0)))) {
        local_e0 = uVar7;
      }
      if ((_Manager_type *)local_c8._M_unused._0_8_ != &local_b8) {
        operator_delete(local_c8._M_unused._M_object,(ulong)(local_b8 + 1));
      }
      uVar7 = uVar7 + 1;
      pbVar5 = (items->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar6 = lVar6 + 0x20;
    } while (uVar7 < (ulong)((long)(items->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar5 >> 5))
    ;
  }
  title_00 = local_60;
  local_78.super___shared_ptr<cursespp::IScrollAdapter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_d8;
  local_78.super___shared_ptr<cursespp::IScrollAdapter,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = local_d0._M_pi;
  if (local_d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_d0._M_pi)->_M_use_count = (local_d0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_d0._M_pi)->_M_use_count = (local_d0._M_pi)->_M_use_count + 1;
    }
  }
  pLVar4 = ListOverlay::SetAdapter(local_98,&local_78);
  pLVar4 = ListOverlay::SetTitle(pLVar4,title_00);
  iVar3 = Screen::GetWidth();
  pLVar4 = ListOverlay::SetWidth(pLVar4,(int)((float)iVar3 * 0.8));
  pLVar4 = ListOverlay::SetSelectedIndex(pLVar4,local_e0);
  pLVar4 = ListOverlay::SetAutoDismiss(pLVar4,true);
  std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>::
  function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
            *)&local_c8,local_68);
  local_a8 = local_d8;
  p_Stack_a0 = local_d0._M_pi;
  if (local_d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_d0._M_pi)->_M_use_count = (local_d0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_d0._M_pi)->_M_use_count = (local_d0._M_pi)->_M_use_count + 1;
    }
  }
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_58._M_unused._M_object = operator_new(0x30);
  p_Var2 = p_Stack_a0;
  *(undefined8 *)local_58._M_unused._0_8_ = 0;
  *(undefined8 *)((long)local_58._M_unused._0_8_ + 8) = 0;
  *(undefined8 *)((long)local_58._M_unused._0_8_ + 0x10) = 0;
  *(undefined8 *)((long)local_58._M_unused._0_8_ + 0x18) = uStack_b0;
  if (local_b8 != (_Manager_type)0x0) {
    *(void **)local_58._M_unused._0_8_ = local_c8._M_unused._M_object;
    *(undefined8 *)((long)local_58._M_unused._0_8_ + 8) = local_c8._8_8_;
    *(_Manager_type *)((long)local_58._M_unused._0_8_ + 0x10) = local_b8;
    local_b8 = (_Manager_type)0x0;
    uStack_b0 = 0;
  }
  p_Stack_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(StringListAdapter **)((long)local_58._M_unused._0_8_ + 0x20) = local_a8;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_58._M_unused._0_8_ + 0x28) = p_Var2
  ;
  local_a8 = (StringListAdapter *)0x0;
  pcStack_40 = std::
               _Function_handler<void_(cursespp::ListOverlay_*,_std::shared_ptr<cursespp::IScrollAdapter>,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/clangen[P]cursespp/src/SchemaOverlay.cpp:266:13)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(cursespp::ListOverlay_*,_std::shared_ptr<cursespp::IScrollAdapter>,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/clangen[P]cursespp/src/SchemaOverlay.cpp:266:13)>
             ::_M_manager;
  ListOverlay::SetItemSelectedCallback(pLVar4,(ItemSelectedCallback *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  if (p_Stack_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_a0);
  }
  if (local_b8 != (_Manager_type)0x0) {
    (*local_b8)(&local_c8,&local_c8,__destroy_functor);
  }
  if (local_78.super___shared_ptr<cursespp::IScrollAdapter,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.super___shared_ptr<cursespp::IScrollAdapter,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  this = App::Overlays();
  local_88.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &(local_98->super_OverlayBase).super_LayoutBase.super_ILayout;
  if (local_98 == (ListOverlay *)0x0) {
    local_88.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  local_88.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_90;
  if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_90->_M_use_count = local_90->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_90->_M_use_count = local_90->_M_use_count + 1;
    }
  }
  OverlayStack::Push(this,&local_88);
  if (local_88.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90);
  }
  if (local_d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d0._M_pi);
  }
  return;
}

Assistant:

void SchemaOverlay::ShowListOverlay(
    const std::string& title,
    std::vector<std::string>& items,
    const std::string defaultValue,
    std::function<void(std::string)> cb)
{
    auto stringAdapter = std::make_shared<StringListAdapter>(items);
    std::shared_ptr<ListOverlay> dialog(new ListOverlay());

    size_t index = 0;
    for (size_t i = 0; i < items.size(); i++) {
        auto current = items[i];
        if (current == defaultValue) {
            index = i;
        }
    }

    dialog->SetAdapter(stringAdapter)
        .SetTitle(title)
        .SetWidth(overlayWidth())
        .SetSelectedIndex(index)
        .SetAutoDismiss(true)
        .SetItemSelectedCallback(
            [cb, stringAdapter](ListOverlay* overlay, IScrollAdapterPtr adapter, size_t index) {
                if (cb) {
                    cb(stringAdapter->At(index));
                }
            });

    cursespp::App::Overlays().Push(dialog);
}